

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,int isCdata,int isId,XML_Char *value,
                   XML_Parser parser)

{
  DEFAULT_ATTRIBUTE *pDVar1;
  int local_44;
  int i;
  DEFAULT_ATTRIBUTE *att;
  XML_Parser parser_local;
  XML_Char *value_local;
  int isId_local;
  int isCdata_local;
  ATTRIBUTE_ID *attId_local;
  ELEMENT_TYPE *type_local;
  
  if ((value != (XML_Char *)0x0) || (isId != 0)) {
    for (local_44 = 0; local_44 < type->nDefaultAtts; local_44 = local_44 + 1) {
      if (attId == type->defaultAtts[local_44].id) {
        return 1;
      }
    }
    if (((isId != 0) && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
      type->idAtt = attId;
    }
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      pDVar1 = (DEFAULT_ATTRIBUTE *)
               (**(code **)((long)parser + 0x18))((long)type->allocDefaultAtts * 0x18);
      type->defaultAtts = pDVar1;
    }
    else {
      type->allocDefaultAtts = type->allocDefaultAtts << 1;
      pDVar1 = (DEFAULT_ATTRIBUTE *)
               (**(code **)((long)parser + 0x20))
                         (type->defaultAtts,(long)type->allocDefaultAtts * 0x18);
      type->defaultAtts = pDVar1;
    }
    if (type->defaultAtts == (DEFAULT_ATTRIBUTE *)0x0) {
      return 0;
    }
  }
  pDVar1 = type->defaultAtts + type->nDefaultAtts;
  pDVar1->id = attId;
  pDVar1->value = value;
  pDVar1->isCdata = (char)isCdata;
  if (isCdata == 0) {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = type->nDefaultAtts + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, int isCdata,
                int isId, const XML_Char *value, XML_Parser parser)
{
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && !type->idAtt && !attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = MALLOC(type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    else {
      type->allocDefaultAtts *= 2;
      type->defaultAtts = REALLOC(type->defaultAtts,
                                  type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    if (!type->defaultAtts)
      return 0;
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (!isCdata)
    attId->maybeTokenized = 1;
  type->nDefaultAtts += 1;
  return 1;
}